

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::InitScopeSlotArray(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  anon_class_32_3_e424d871 fn;
  PropertyId *pPVar2;
  FuncInfo *pFVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  Recycler *pRVar7;
  Scope *this_00;
  uint local_dc;
  uint local_cc;
  UINT i_1;
  anon_class_32_3_e424d871 setPropIdsForScopeSlotArray;
  anon_class_16_2_161a6609_for_setPropertyIdForScopeSlotArray setPropertyIdForScopeSlotArray;
  UINT i;
  TrackAllocData local_60;
  PropertyId *local_38;
  PropertyId *propertyIdsForScopeSlotArray;
  FunctionBody *byteCodeFunction;
  byte local_1d;
  uint scopeSlotCountForParamScope;
  bool isSplitScope;
  FuncInfo *pFStack_18;
  uint scopeSlotCount;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  pFStack_18 = funcInfo;
  funcInfo_local = (FuncInfo *)this;
  scopeSlotCountForParamScope = Scope::GetScopeSlotCount(funcInfo->bodyScope);
  bVar4 = FuncInfo::IsBodyAndParamScopeMerged(pFStack_18);
  local_1d = (bVar4 ^ 0xffU) & 1;
  if (((pFStack_18->paramScope != (Scope *)0x0) &&
      (uVar5 = Scope::GetScopeSlotCount(pFStack_18->paramScope), uVar5 != 0)) &&
     ((local_1d & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x717,
                       "(funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope)"
                       ,
                       "funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope"
                      );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (pFStack_18->paramScope == (Scope *)0x0) {
    local_dc = 0;
  }
  else {
    local_dc = Scope::GetScopeSlotCount(pFStack_18->paramScope);
  }
  byteCodeFunction._4_4_ = local_dc;
  if ((scopeSlotCountForParamScope != 0) || (local_dc != 0)) {
    propertyIdsForScopeSlotArray = (PropertyId *)FuncInfo::GetParsedFunctionBody(pFStack_18);
    if ((scopeSlotCountForParamScope != 0) || (byteCodeFunction._4_4_ != 0)) {
      Js::ParseableFunctionInfo::SetScopeSlotArraySizes
                ((ParseableFunctionInfo *)propertyIdsForScopeSlotArray,scopeSlotCountForParamScope,
                 byteCodeFunction._4_4_);
    }
    if (scopeSlotCountForParamScope != 0) {
      pRVar7 = Js::ScriptContext::GetRecycler(this->scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&int::typeinfo,0,(ulong)scopeSlotCountForParamScope,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                 ,0x728);
      pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_60);
      local_38 = Memory::AllocateArray<Memory::Recycler,int,false>
                           ((Memory *)pRVar7,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                            (ulong)scopeSlotCountForParamScope);
      Js::ParseableFunctionInfo::SetPropertyIdsForScopeSlotArray
                ((ParseableFunctionInfo *)propertyIdsForScopeSlotArray,local_38,
                 scopeSlotCountForParamScope,byteCodeFunction._4_4_);
      bVar4 = Js::ParseableFunctionInfo::IsReparsed
                        ((ParseableFunctionInfo *)propertyIdsForScopeSlotArray);
      if (((bVar4) &&
          (bVar4 = Js::ParseableFunctionInfo::WasEverAsmJsMode
                             ((ParseableFunctionInfo *)propertyIdsForScopeSlotArray), !bVar4)) &&
         (propertyIdsForScopeSlotArray[0x19] != scopeSlotCountForParamScope)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x72b,
                           "(!byteCodeFunction->IsReparsed() || byteCodeFunction->WasEverAsmJsMode() || byteCodeFunction->scopeSlotArraySize == scopeSlotCount)"
                           ,"The slot array size is different between debug and non-debug mode");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pFVar3 = pFStack_18;
      pPVar2 = local_38;
      for (setPropertyIdForScopeSlotArray.propertyIdsForScopeSlotArray._4_4_ = 0;
          setPropertyIdForScopeSlotArray.propertyIdsForScopeSlotArray._4_4_ <
          scopeSlotCountForParamScope;
          setPropertyIdForScopeSlotArray.propertyIdsForScopeSlotArray._4_4_ =
               setPropertyIdForScopeSlotArray.propertyIdsForScopeSlotArray._4_4_ + 1) {
        local_38[setPropertyIdForScopeSlotArray.propertyIdsForScopeSlotArray._4_4_] = -1;
      }
      fn.setPropertyIdForScopeSlotArray._4_4_ =
           setPropIdsForScopeSlotArray.setPropertyIdForScopeSlotArray.propertyIdsForScopeSlotArray.
           _4_4_;
      fn.setPropertyIdForScopeSlotArray.scopeSlotCount = scopeSlotCountForParamScope;
      this_00 = FuncInfo::GetBodyScope(pFStack_18);
      fn.funcInfo = pFVar3;
      fn.this = this;
      fn.setPropertyIdForScopeSlotArray.propertyIdsForScopeSlotArray = pPVar2;
      Scope::ForEachSymbol<ByteCodeGenerator::InitScopeSlotArray(FuncInfo*)::__0>(this_00,fn);
      for (local_cc = 0; local_cc < scopeSlotCountForParamScope; local_cc = local_cc + 1) {
        if ((local_38[local_cc] == -1) && (pFStack_18->frameObjRegister == 0xffffffff)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x74d,
                             "(propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty || funcInfo->frameObjRegister != Js::Constants::NoRegister)"
                             ,
                             "propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty || funcInfo->frameObjRegister != Js::Constants::NoRegister"
                            );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::InitScopeSlotArray(FuncInfo * funcInfo)
{
    // Record slots info for ScopeSlots/ScopeObject.
    uint scopeSlotCount = funcInfo->bodyScope->GetScopeSlotCount();
    bool isSplitScope = !funcInfo->IsBodyAndParamScopeMerged();
    Assert(funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope);
    uint scopeSlotCountForParamScope = funcInfo->paramScope != nullptr ? funcInfo->paramScope->GetScopeSlotCount() : 0;

    if (scopeSlotCount == 0 && scopeSlotCountForParamScope == 0)
    {
        return;
    }

    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    if (scopeSlotCount > 0 || scopeSlotCountForParamScope > 0)
    {
        byteCodeFunction->SetScopeSlotArraySizes(scopeSlotCount, scopeSlotCountForParamScope);
    }

    // TODO: Need to add property ids for the case when scopeSlotCountForParamSCope is non-zero
    if (scopeSlotCount)
    {
        Js::PropertyId *propertyIdsForScopeSlotArray = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), Js::PropertyId, scopeSlotCount);
        byteCodeFunction->SetPropertyIdsForScopeSlotArray(propertyIdsForScopeSlotArray, scopeSlotCount, scopeSlotCountForParamScope);
        AssertMsg(!byteCodeFunction->IsReparsed() || byteCodeFunction->WasEverAsmJsMode() || byteCodeFunction->scopeSlotArraySize == scopeSlotCount,
            "The slot array size is different between debug and non-debug mode");
#if DEBUG
        for (UINT i = 0; i < scopeSlotCount; i++)
        {
            propertyIdsForScopeSlotArray[i] = Js::Constants::NoProperty;
        }
#endif
        auto setPropertyIdForScopeSlotArray =
            [scopeSlotCount, propertyIdsForScopeSlotArray]
            (Js::PropertyId slot, Js::PropertyId propId)
        {
            if (slot < 0 || (uint)slot >= scopeSlotCount)
            {
                Js::Throw::FatalInternalError();
            }
            propertyIdsForScopeSlotArray[slot] = propId;
        };

        auto setPropIdsForScopeSlotArray = [this, funcInfo, setPropertyIdForScopeSlotArray](Symbol *const sym)
        {
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                // All properties should get correct propertyId here.
                Assert(sym->HasScopeSlot()); // We can't allocate scope slot now. Any symbol needing scope slot must have allocated it before this point.
                setPropertyIdForScopeSlotArray(sym->GetScopeSlot(), sym->EnsurePosition(funcInfo));
            }
        };

        funcInfo->GetBodyScope()->ForEachSymbol(setPropIdsForScopeSlotArray);

#if DEBUG
        for (UINT i = 0; i < scopeSlotCount; i++)
        {
            Assert(propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty
                || funcInfo->frameObjRegister != Js::Constants::NoRegister); // ScopeObject may have unassigned entries, e.g. for same-named parameters
        }
#endif
    }
}